

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_dump_listener.c
# Opt level: O3

void ht_file_dump_listener_stop(HT_FileDumpListener *listener)

{
  ht_mutex_lock(listener->mtx);
  if (listener->p_file != (FILE *)0x0) {
    ht_listener_buffer_flush(&listener->buffer,_ht_file_dump_listener_flush,listener);
    ht_listener_buffer_deinit(&listener->buffer);
    fclose((FILE *)listener->p_file);
    listener->p_file = (FILE *)0x0;
  }
  ht_mutex_unlock(listener->mtx);
  return;
}

Assistant:

void
ht_file_dump_listener_stop(HT_FileDumpListener* listener)
{
    ht_mutex_lock(listener->mtx);

    if (_ht_file_dump_listener_is_stopped(listener))
    {
        ht_mutex_unlock(listener->mtx);
        return;
    }

    ht_listener_buffer_flush(&listener->buffer, _ht_file_dump_listener_flush, listener);
    ht_listener_buffer_deinit(&listener->buffer);
    fclose(listener->p_file);
    listener->p_file = NULL;

    ht_mutex_unlock(listener->mtx);
}